

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclablePromiseObjectDisplay::CreateWalker(RecyclablePromiseObjectDisplay *this)

{
  LONG *pLVar1;
  ReferencedArenaAdapter *pRVar2;
  RecyclablePromiseObjectWalker *this_00;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar3;
  ArenaAllocator *alloc_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pRVar2 = DebugManager::GetDiagnosticArena
                     (((this->super_RecyclableObjectDisplay).scriptContext)->threadContext->
                      debugManager);
  if (pRVar2 == (ReferencedArenaAdapter *)0x0) {
    pWVar3 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  }
  else {
    alloc_00 = (ArenaAllocator *)0x0;
    if (pRVar2->deleteFlag == false) {
      alloc_00 = pRVar2->arena;
    }
    this_00 = (RecyclablePromiseObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc_00,0x35916e);
    RecyclablePromiseObjectWalker::RecyclablePromiseObjectWalker
              (this_00,(this->super_RecyclableObjectDisplay).scriptContext,
               (this->super_RecyclableObjectDisplay).instance);
    local_48 = (undefined1  [8])
               &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3c7cb59;
    data.filename._0_4_ = 0xedd;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    pWVar3 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
             new<Memory::HeapAllocator>(0x10,alloc,0x2f6726);
    pWVar3->adapter = pRVar2;
    pWVar3->p = (IDiagObjectModelWalkerBase *)this_00;
    LOCK();
    pLVar1 = &(pRVar2->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + 1;
    UNLOCK();
  }
  return pWVar3;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclablePromiseObjectDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclablePromiseObjectWalker, scriptContext, instance);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, pOMWalker);
        }
        return nullptr;
    }